

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_28494c::CAPIBuildSystemFrontendDelegate::commandHadNote
          (CAPIBuildSystemFrontendDelegate *this,Command *command,StringRef message)

{
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *p_Var1;
  llb_data_t cMessage;
  llb_data_t local_10;
  
  local_10.length = message.Length;
  local_10.data = (uint8_t *)message.Data;
  p_Var1 = (this->cAPIDelegate).command_had_note;
  if (p_Var1 != (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *)0x0) {
    (*p_Var1)((this->cAPIDelegate).context,(llb_buildsystem_command_t *)command,&local_10);
  }
  return;
}

Assistant:

virtual void commandHadNote(Command* command, StringRef message) override {
    if (cAPIDelegate.command_had_note) {
      llb_data_t cMessage { message.size(), (const uint8_t*) message.data() };
      cAPIDelegate.command_had_note(
          cAPIDelegate.context,
          (llb_buildsystem_command_t*) command,
          &cMessage);
    }
  }